

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void printfmt<char_const*,unsigned_int,unsigned_int>
               (ostream *out,char *format,char **arg,uint *args,uint *args_1)

{
  char *pcStack_38;
  uchar ch;
  char *s;
  uint *args_local_1;
  uint *args_local;
  char **arg_local;
  char *format_local;
  ostream *out_local;
  
  pcStack_38 = format;
  while( true ) {
    if (*pcStack_38 == '\0') {
      return;
    }
    if ((*pcStack_38 == '{') && (pcStack_38[1] == '}')) break;
    std::operator<<(out,*pcStack_38);
    pcStack_38 = pcStack_38 + 1;
  }
  print<char_const*>(out,arg);
  printfmt<unsigned_int,unsigned_int>(out,pcStack_38 + 2,args,args_1);
  return;
}

Assistant:

inline void printfmt(std::ostream& out, const char *format, const T& arg, const Args&... args) {
    char* s = const_cast<char*>(format);
    for (unsigned char ch; (ch = *s) != '\0'; out << *s++) {
        if (ch == '{' && *(s+1) == '}') {
            print(out, arg);
            printfmt(out, s+2, args...);
            break;
        }
    }
}